

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

uint8_t * bcf_unpack_info_core1(uint8_t *ptr,bcf_info_t *info)

{
  int32_t iVar1;
  uint32_t uVar2;
  anon_union_4_2_947300a4_for_v1 aVar3;
  int *local_20;
  
  local_20 = (int *)ptr;
  iVar1 = bcf_dec_typed_int1(ptr,(uint8_t **)&local_20);
  info->key = iVar1;
  iVar1 = bcf_dec_size((uint8_t *)local_20,(uint8_t **)&local_20,&info->type);
  info->len = iVar1;
  info->vptr = (uint8_t *)local_20;
  *(uint *)&info->field_0x1c = (int)local_20 - (int)ptr & 0x7fffffff;
  (info->v1).i = 0;
  if (iVar1 != 1) goto switchD_00116340_caseD_4;
  switch(info->type) {
  case 1:
  case 7:
    aVar3 = (anon_union_4_2_947300a4_for_v1)(int)(char)*local_20;
    break;
  case 2:
    aVar3 = (anon_union_4_2_947300a4_for_v1)(int)(short)*local_20;
    break;
  case 3:
    aVar3.i = *local_20;
    break;
  default:
    goto switchD_00116340_caseD_4;
  case 5:
    (info->v1).i = *local_20;
    goto switchD_00116340_caseD_4;
  }
  info->v1 = aVar3;
switchD_00116340_caseD_4:
  uVar2 = iVar1 << (bcf_type_shift[info->type] & 0x1f);
  info->vptr_len = uVar2;
  return (uint8_t *)((long)local_20 + (long)(int)uVar2);
}

Assistant:

static inline uint8_t *bcf_unpack_info_core1(uint8_t *ptr, bcf_info_t *info)
{
    uint8_t *ptr_start = ptr;
    info->key = bcf_dec_typed_int1(ptr, &ptr);
    info->len = bcf_dec_size(ptr, &ptr, &info->type);
    info->vptr = ptr;
    info->vptr_off  = ptr - ptr_start;
    info->vptr_free = 0;
    info->v1.i = 0;
    if (info->len == 1) {
        if (info->type == BCF_BT_INT8 || info->type == BCF_BT_CHAR) info->v1.i = *(int8_t*)ptr;
        else if (info->type == BCF_BT_INT32) info->v1.i = *(int32_t*)ptr;
        else if (info->type == BCF_BT_FLOAT) info->v1.f = *(float*)ptr;
        else if (info->type == BCF_BT_INT16) info->v1.i = *(int16_t*)ptr;
    }
    ptr += info->len << bcf_type_shift[info->type];
    info->vptr_len = ptr - info->vptr;
    return ptr;
}